

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

String * __thiscall Value::toJSON(String *__return_storage_ptr__,Value *this,bool pretty)

{
  cJSON *item;
  undefined8 local_50;
  char *formatted;
  cJSON *json;
  bool pretty_local;
  Value *this_local;
  String *ret;
  
  item = toCJSON(this);
  if (pretty) {
    local_50 = cJSON_Print(item);
  }
  else {
    local_50 = cJSON_PrintUnformatted(item);
  }
  cJSON_Delete(item);
  String::String(__return_storage_ptr__,local_50,0xffffffffffffffff);
  free(local_50);
  return __return_storage_ptr__;
}

Assistant:

String Value::toJSON(bool pretty) const
{
    cJSON *json = toCJSON(*this);
    char *formatted = (pretty ? cJSON_Print(json) : cJSON_PrintUnformatted(json));
    cJSON_Delete(json);
    const String ret = formatted;
    free(formatted);
    return ret;
}